

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *err,istream *inStream,MaterialReader *readMatFn,bool triangulate)

{
  byte bVar1;
  vertex_index *pvVar2;
  pointer pvVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  pointer pfVar7;
  undefined1 auVar8 [16];
  vertex_index *pvVar9;
  pointer pfVar10;
  pointer pfVar11;
  pointer pfVar12;
  pointer pfVar13;
  pointer pfVar14;
  pointer pfVar15;
  pointer pfVar16;
  pointer pfVar17;
  string *this;
  pointer pvVar18;
  pointer pvVar19;
  _Alloc_hider _Var20;
  pointer paVar21;
  pointer paVar22;
  pointer puVar23;
  pointer puVar24;
  pointer piVar25;
  pointer piVar26;
  bool bVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  size_t sVar32;
  long lVar33;
  iterator iVar34;
  mapped_type *pmVar35;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  int material_id;
  mapped_type mVar36;
  pointer pvVar37;
  int iVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  ulong uVar40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  byte *__s;
  byte *pbVar42;
  ulong uVar43;
  size_type sVar44;
  size_type sVar45;
  real_t rVar46;
  real_t y;
  real_t z;
  string name;
  vector<float,_std::allocator<float>_> vn;
  vector<float,_std::allocator<float>_> v;
  real_t r;
  vector<float,_std::allocator<float>_> vc;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  faceGroup;
  vector<float,_std::allocator<float>_> vt;
  string linebuf;
  real_t b;
  real_t g;
  shape_t shape;
  real_t x;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> tags;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  key_type local_588;
  ulong local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  string *local_530;
  string local_528;
  pointer local_508;
  iterator iStack_500;
  pointer local_4f8;
  pointer local_4e8;
  iterator iStack_4e0;
  pointer local_4d8;
  int local_4d0;
  real_t local_4cc;
  pointer local_4c8;
  iterator iStack_4c0;
  pointer local_4b8;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  local_4a8;
  pointer local_488;
  iterator iStack_480;
  pointer local_478;
  size_type local_470;
  string local_468;
  real_t local_448;
  real_t local_444;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *local_440;
  shape_t local_438;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  vector<int,_std::allocator<int>_> local_398;
  vector<float,_std::allocator<float>_> vStack_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> vStack_350;
  ios_base aiStack_338 [272];
  ios_base *local_228;
  MaterialReader *local_220;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> local_218;
  pointer local_200;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_1f8;
  attrib_t *local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_440 = shapes;
  local_220 = readMatFn;
  local_1f8 = materials;
  local_1f0 = attrib;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_4d8 = (pointer)0x0;
  local_4e8 = (pointer)0x0;
  iStack_4e0._M_current = (pointer)0x0;
  local_4f8 = (pointer)0x0;
  local_508 = (pointer)0x0;
  iStack_500._M_current = (pointer)0x0;
  local_478 = (pointer)0x0;
  local_488 = (pointer)0x0;
  iStack_480._M_current = (pointer)0x0;
  local_4b8 = (pointer)0x0;
  local_4c8 = (pointer)0x0;
  iStack_4c0._M_current = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438.name._M_dataplus._M_p = (pointer)&local_438.name.field_2;
  local_438.name._M_string_length = 0;
  local_438.name.field_2._M_local_buf[0] = '\0';
  local_438.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  local_468._M_string_length = 0;
  local_468.field_2._M_local_buf[0] = '\0';
  local_228 = aiStack_338;
  material_id = -1;
  local_530 = err;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_001083d6:
  do {
    iVar28 = std::istream::peek();
    if (iVar28 == -1) {
      bVar27 = exportFaceGroupToShape
                         (&local_438,&local_4a8,&local_218,material_id,&local_528,triangulate);
      if ((bVar27) ||
         (local_438.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_438.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                  (local_440,&local_438);
      }
      pvVar19 = local_4a8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar18 = local_4a8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar37 = local_4a8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_4a8.
          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_4a8.
          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pvVar3 = (pvVar37->
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pvVar3 != (pointer)0x0) {
            operator_delete(pvVar3,(long)(pvVar37->
                                         super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar3);
          }
          pvVar37 = pvVar37 + 1;
        } while (pvVar37 != pvVar19);
        local_4a8.
        super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar18;
      }
      this = local_530;
      if (local_530 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this,(char *)local_3b8._0_8_,local_3b8._8_8_);
        if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
        }
      }
      pfVar10 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar11 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar4 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_4e8;
      (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iStack_4e0._M_current;
      (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_4d8;
      pfVar12 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar13 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar5 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_508;
      (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iStack_500._M_current;
      (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_4f8;
      pfVar14 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar15 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar6 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_488;
      (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iStack_480._M_current;
      (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_478;
      pfVar16 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar17 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar7 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_4c8;
      (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iStack_4c0._M_current;
      (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_4b8;
      local_508 = pfVar12;
      iStack_500._M_current = pfVar13;
      local_4f8 = pfVar5;
      local_4e8 = pfVar10;
      iStack_4e0._M_current = pfVar11;
      local_4d8 = pfVar4;
      local_4c8 = pfVar16;
      iStack_4c0._M_current = pfVar17;
      local_4b8 = pfVar7;
      local_488 = pfVar14;
      iStack_480._M_current = pfVar15;
      local_478 = pfVar6;
LAB_0010a062:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&local_438.mesh.tags);
      if ((pointer)local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_438.mesh.material_ids.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.mesh.material_ids.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_438.mesh.num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.mesh.num_face_vertices.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_438.mesh.num_face_vertices.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.mesh.num_face_vertices.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_438.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.mesh.indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_438.mesh.indices.
                              super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.mesh.indices.
                              super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.name._M_dataplus._M_p != &local_438.name.field_2) {
        operator_delete(local_438.name._M_dataplus._M_p,
                        CONCAT71(local_438.name.field_2._M_allocated_capacity._1_7_,
                                 local_438.name.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,
                        CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                                 local_528.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
      ::~vector(&local_4a8);
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&local_218);
      if (local_4c8 != (pointer)0x0) {
        operator_delete(local_4c8,(long)local_4b8 - (long)local_4c8);
      }
      if (local_488 != (pointer)0x0) {
        operator_delete(local_488,(long)local_478 - (long)local_488);
      }
      if (local_508 != (pointer)0x0) {
        operator_delete(local_508,(long)local_4f8 - (long)local_508);
      }
      if (local_4e8 != (pointer)0x0) {
        operator_delete(local_4e8,(long)local_4d8 - (long)local_4e8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return iVar28 == -1;
    }
    safeGetline(inStream,&local_468);
    _Var20._M_p = local_468._M_dataplus._M_p;
    if ((local_468._M_string_length != 0) &&
       (local_468._M_dataplus._M_p[local_468._M_string_length - 1] == '\n')) {
      local_468._M_string_length = local_468._M_string_length - 1;
      local_468._M_dataplus._M_p[local_468._M_string_length] = '\0';
    }
    if ((local_468._M_string_length != 0) &&
       (local_468._M_dataplus._M_p[local_468._M_string_length - 1] == '\r')) {
      local_468._M_string_length = local_468._M_string_length - 1;
      local_468._M_dataplus._M_p[local_468._M_string_length] = '\0';
    }
    if (local_468._M_string_length == 0) goto LAB_001083d6;
    local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p;
    sVar32 = strspn(local_468._M_dataplus._M_p," \t");
    paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(_Var20._M_p + sVar32);
    local_590 = paVar39;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                    ,0x620,
                    "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                   );
    }
    bVar1 = paVar39->_M_local_buf[0];
    local_560 = CONCAT44(local_560._4_4_,2);
    if ((bVar1 != 0) && (bVar1 != 0x23)) {
      if ((bVar1 == 0x76) && ((paVar39->_M_local_buf[1] == 0x20 || (paVar39->_M_local_buf[1] == 9)))
         ) {
        local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar39->_M_local_buf + 2);
        rVar46 = parseReal((char **)&local_590,0.0);
        local_3b8._0_4_ = rVar46;
        rVar46 = parseReal((char **)&local_590,0.0);
        local_588._M_dataplus._M_p._0_4_ = rVar46;
        rVar46 = parseReal((char **)&local_590,0.0);
        local_558._M_dataplus._M_p._0_4_ = rVar46;
        local_4cc = parseReal((char **)&local_590,1.0);
        local_444 = parseReal((char **)&local_590,1.0);
        local_448 = parseReal((char **)&local_590,1.0);
        if (iStack_4e0._M_current == local_4d8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4e8,iStack_4e0,(float *)local_3b8
                    );
        }
        else {
          *iStack_4e0._M_current = (float)local_3b8._0_4_;
          iStack_4e0._M_current = iStack_4e0._M_current + 1;
        }
        if (iStack_4e0._M_current == local_4d8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4e8,iStack_4e0,
                     (float *)&local_588);
        }
        else {
          *iStack_4e0._M_current = local_588._M_dataplus._M_p._0_4_;
          iStack_4e0._M_current = iStack_4e0._M_current + 1;
        }
        if (iStack_4e0._M_current == local_4d8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4e8,iStack_4e0,
                     (float *)&local_558);
        }
        else {
          *iStack_4e0._M_current = local_558._M_dataplus._M_p._0_4_;
          iStack_4e0._M_current = iStack_4e0._M_current + 1;
        }
        if (iStack_4c0._M_current == local_4b8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_4cc);
        }
        else {
          *iStack_4c0._M_current = local_4cc;
          iStack_4c0._M_current = iStack_4c0._M_current + 1;
        }
        if (iStack_4c0._M_current == local_4b8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_444);
        }
        else {
          *iStack_4c0._M_current = local_444;
          iStack_4c0._M_current = iStack_4c0._M_current + 1;
        }
        if (iStack_4c0._M_current == local_4b8) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_448);
        }
        else {
          *iStack_4c0._M_current = local_448;
          iStack_4c0._M_current = iStack_4c0._M_current + 1;
        }
      }
      else if (bVar1 == 0x76) {
        if ((paVar39->_M_local_buf[1] == 0x6e) &&
           ((paVar39->_M_local_buf[2] == 0x20 || (paVar39->_M_local_buf[2] == 9)))) {
          local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar39->_M_local_buf + 3);
          rVar46 = parseReal((char **)&local_590,0.0);
          local_3b8._0_4_ = rVar46;
          rVar46 = parseReal((char **)&local_590,0.0);
          local_588._M_dataplus._M_p._0_4_ = rVar46;
          rVar46 = parseReal((char **)&local_590,0.0);
          local_558._M_dataplus._M_p._0_4_ = rVar46;
          if (iStack_500._M_current == local_4f8) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                       (float *)local_3b8);
          }
          else {
            *iStack_500._M_current = (float)local_3b8._0_4_;
            iStack_500._M_current = iStack_500._M_current + 1;
          }
          if (iStack_500._M_current == local_4f8) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                       (float *)&local_588);
          }
          else {
            *iStack_500._M_current = local_588._M_dataplus._M_p._0_4_;
            iStack_500._M_current = iStack_500._M_current + 1;
          }
          if (iStack_500._M_current == local_4f8) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                       (float *)&local_558);
          }
          else {
            *iStack_500._M_current = local_558._M_dataplus._M_p._0_4_;
            iStack_500._M_current = iStack_500._M_current + 1;
          }
        }
        else {
          if ((paVar39->_M_local_buf[1] != 0x74) ||
             ((paVar39->_M_local_buf[2] != 0x20 && (paVar39->_M_local_buf[2] != 9))))
          goto LAB_001086db;
          local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar39->_M_local_buf + 3);
          rVar46 = parseReal((char **)&local_590,0.0);
          local_3b8._0_4_ = rVar46;
          rVar46 = parseReal((char **)&local_590,0.0);
          local_588._M_dataplus._M_p._0_4_ = rVar46;
          if (iStack_480._M_current == local_478) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_488,iStack_480,
                       (float *)local_3b8);
          }
          else {
            *iStack_480._M_current = (float)local_3b8._0_4_;
            iStack_480._M_current = iStack_480._M_current + 1;
          }
          if (iStack_480._M_current == local_478) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_488,iStack_480,
                       (float *)&local_588);
          }
          else {
            *iStack_480._M_current = local_588._M_dataplus._M_p._0_4_;
            iStack_480._M_current = iStack_480._M_current + 1;
          }
        }
      }
      else {
LAB_001086db:
        if ((bVar1 == 0x66) &&
           ((paVar39->_M_local_buf[1] == 0x20 || (paVar39->_M_local_buf[1] == 9)))) {
          local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar39->_M_local_buf + 2);
          sVar32 = strspn(local_590->_M_local_buf," \t");
          local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar39->_M_local_buf + sVar32 + 2);
          local_3b8._0_8_ = (pointer)0x0;
          local_3b8._8_8_ = (vertex_index *)0x0;
          local_3a8._M_allocated_capacity = 0;
          std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::reserve
                    ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)
                     local_3b8,3);
          paVar39 = local_590;
          do {
            if (((byte)paVar39->_M_local_buf[0] < 0xe) &&
               ((0x2401U >> ((byte)paVar39->_M_local_buf[0] & 0x1f) & 1) != 0)) {
              local_588._M_dataplus._M_p = (pointer)0x0;
              local_588._M_string_length = 0;
              local_588.field_2._M_allocated_capacity = 0;
              local_590 = paVar39;
              std::
              vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
              ::
              emplace_back<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>
                        ((vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
                          *)&local_4a8,
                         (vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)
                         &local_588);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_588._M_dataplus._M_p,
                                local_588.field_2._M_allocated_capacity -
                                (long)local_588._M_dataplus._M_p);
              }
              pvVar3 = local_4a8.
                       super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar9 = local_4a8.
                       super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pvVar2 = local_4a8.
                       super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_4a8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b8._0_8_;
              local_4a8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b8._8_8_;
              local_4a8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_3a8._M_allocated_capacity;
              local_560 = CONCAT44(local_560._4_4_,2);
              local_3b8._0_8_ = pvVar3;
              local_3b8._8_8_ = pvVar9;
              local_3a8._M_allocated_capacity = (size_type)pvVar2;
              goto LAB_00108edd;
            }
            local_588._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            local_588._M_string_length = CONCAT44(local_588._M_string_length._4_4_,0xffffffff);
            lVar33 = (long)iStack_4e0._M_current - (long)local_4e8;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = (long)iStack_500._M_current - (long)local_508 >> 2;
            local_560 = SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
            uVar43 = (long)iStack_480._M_current - (long)local_488;
            iVar29 = atoi(paVar39->_M_local_buf);
            iVar31 = (int)((ulong)(lVar33 >> 2) / 3) + iVar29;
            if (iVar29 == 0) {
              iVar31 = -1;
            }
            if (0 < iVar29) {
              iVar31 = iVar29 + -1;
            }
            if (iVar29 != 0) {
              sVar32 = strcspn(paVar39->_M_local_buf,"/ \t\r");
              paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar39->_M_local_buf + sVar32);
              if (paVar39->_M_local_buf[sVar32] == 0x2f) {
                uVar40 = local_560 >> 1;
                if (paVar41->_M_local_buf[1] == 0x2f) {
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar41->_M_local_buf + 2);
                  iVar30 = atoi(paVar39->_M_local_buf);
                  if (iVar30 != 0) {
                    iVar29 = -1;
                    iVar38 = (int)uVar40;
                    if (0 < iVar30) {
                      iVar38 = -1;
                    }
                    iVar38 = iVar38 + iVar30;
                    sVar32 = strcspn(paVar39->_M_local_buf,"/ \t\r");
                    paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + sVar32);
LAB_0010883f:
                    goto LAB_00108855;
                  }
                }
                else {
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar41->_M_local_buf + 1);
                  iVar38 = atoi(paVar39->_M_local_buf);
                  iVar29 = (int)(uVar43 >> 3) + iVar38;
                  if (iVar38 == 0) {
                    iVar29 = -1;
                  }
                  if (0 < iVar38) {
                    iVar29 = iVar38 + -1;
                  }
                  if (iVar38 != 0) {
                    local_560 = uVar40;
                    sVar32 = strcspn(paVar39->_M_local_buf,"/ \t\r");
                    paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + sVar32);
                    if (paVar39->_M_local_buf[sVar32] != 0x2f) goto LAB_0010884f;
                    paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar41->_M_local_buf + 1);
                    iVar38 = atoi(paVar39->_M_local_buf);
                    if (iVar38 == 0) goto LAB_001087df;
                    iVar30 = (int)local_560;
                    if (0 < iVar38) {
                      iVar30 = -1;
                    }
                    local_560 = (ulong)(uint)(iVar30 + iVar38);
                    sVar32 = strcspn(paVar39->_M_local_buf,"/ \t\r");
                    paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + sVar32);
                    iVar38 = (int)local_560;
                    goto LAB_0010883f;
                  }
                }
                bVar27 = false;
              }
              else {
                iVar29 = -1;
LAB_0010884f:
                iVar38 = -1;
                paVar39 = paVar41;
LAB_00108855:
                local_588._M_dataplus._M_p._4_4_ = iVar29;
                local_588._M_dataplus._M_p._0_4_ = (real_t)iVar31;
                local_588._M_string_length = CONCAT44(local_588._M_string_length._4_4_,iVar38);
                bVar27 = true;
              }
            }
            else {
LAB_001087df:
              bVar27 = false;
            }
            err = local_530;
            if (bVar27) {
              if (local_3b8._8_8_ == local_3a8._M_allocated_capacity) {
                std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>::
                _M_realloc_insert<tinyobj::vertex_index_const&>
                          ((vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>> *)
                           local_3b8,(iterator)local_3b8._8_8_,(vertex_index *)&local_588);
              }
              else {
                *(int *)(local_3b8._8_8_ + 8) = (int)local_588._M_string_length;
                *(pointer *)local_3b8._8_8_ = local_588._M_dataplus._M_p;
                local_3b8._8_8_ = local_3b8._8_8_ + 0xc;
              }
              sVar32 = strspn(paVar39->_M_local_buf," \t\r");
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar39->_M_local_buf + sVar32);
            }
            else if (local_530 !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(local_530,0,local_530->_M_string_length,
                         "Failed parse `f\' line(e.g. zero value for face index).\n",0x37);
            }
          } while (bVar27);
          local_560 = CONCAT44(local_560._4_4_,1);
          local_590 = paVar39;
LAB_00108edd:
          if ((pointer)local_3b8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_3b8._0_8_,
                            local_3a8._M_allocated_capacity - local_3b8._0_8_);
          }
        }
        else {
          iVar31 = strncmp(paVar39->_M_local_buf,"usemtl",6);
          if ((iVar31 == 0) &&
             ((paVar39->_M_local_buf[6] == 0x20 || (paVar39->_M_local_buf[6] == 9)))) {
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar39->_M_local_buf + 7);
            local_590 = paVar39;
            std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
            sVar32 = strlen(paVar39->_M_local_buf);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3b8 + 0x10),paVar39->_M_local_buf,sVar32);
            std::__cxx11::stringbuf::str();
            iVar34 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&local_1e8,&local_588);
            if ((_Rb_tree_header *)iVar34._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
              mVar36 = -1;
            }
            else {
              pmVar35 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_1e8,&local_588);
              mVar36 = *pmVar35;
            }
            if ((mVar36 != material_id) &&
               (exportFaceGroupToShape
                          (&local_438,&local_4a8,&local_218,material_id,&local_528,triangulate),
               pvVar19 = local_4a8.
                         super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               pvVar18 = local_4a8.
                         super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pvVar37 = local_4a8.
                         super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, err = local_530,
               material_id = mVar36,
               local_4a8.
               super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_4a8.
               super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
              do {
                pvVar3 = (pvVar37->
                         super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (pvVar3 != (pointer)0x0) {
                  operator_delete(pvVar3,(long)(pvVar37->
                                               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                               )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pvVar3);
                }
                pvVar37 = pvVar37 + 1;
              } while (pvVar37 != pvVar19);
              local_4a8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pvVar18;
              err = local_530;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_3b8);
            std::ios_base::~ios_base(local_228);
          }
          else {
            iVar31 = strncmp(paVar39->_M_local_buf,"mtllib",6);
            if ((iVar31 == 0) &&
               ((paVar39->_M_local_buf[6] == 0x20 || (paVar39->_M_local_buf[6] == 9)))) {
              if (local_220 != (MaterialReader *)0x0) {
                local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar39->_M_local_buf + 7);
                local_558._M_dataplus._M_p = (pointer)0x0;
                local_558._M_string_length = 0;
                local_558.field_2._M_allocated_capacity = 0;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_3b8,local_590->_M_local_buf,(allocator<char> *)&local_588
                          );
                SplitString((string *)local_3b8,(char)&local_558,elems);
                if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                  operator_delete((void *)local_3b8._0_8_,
                                  (ulong)(local_3a8._M_allocated_capacity + 1));
                }
                if (local_558._M_dataplus._M_p == (pointer)local_558._M_string_length) {
                  if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(err,
                             "WARN: Looks like empty filename for mtllib. Use default material. \n")
                    ;
                  }
                }
                else {
                  if ((pointer)local_558._M_string_length == local_558._M_dataplus._M_p) {
                    bVar27 = false;
                  }
                  else {
                    lVar33 = 0;
                    bVar27 = false;
                    uVar43 = 0;
                    do {
                      local_3b8._0_8_ = local_3b8 + 0x10;
                      local_3b8._8_8_ = (vertex_index *)0x0;
                      local_3a8._M_allocated_capacity =
                           local_3a8._M_allocated_capacity & 0xffffffffffffff00;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_588,
                                 *(char **)(local_558._M_dataplus._M_p + lVar33),
                                 (allocator<char> *)&local_4cc);
                      iVar31 = (*local_220->_vptr_MaterialReader[2])
                                         (local_220,&local_588,local_1f8,&local_1e8,local_3b8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_588._M_dataplus._M_p != &local_588.field_2) {
                        operator_delete(local_588._M_dataplus._M_p,
                                        local_588.field_2._M_allocated_capacity + 1);
                      }
                      if ((local_530 !=
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                         && ((vertex_index *)local_3b8._8_8_ != (vertex_index *)0x0)) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (local_530,(char *)local_3b8._0_8_,local_3b8._8_8_);
                      }
                      if ((char)iVar31 != '\0') {
                        bVar27 = true;
                      }
                      if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                        operator_delete((void *)local_3b8._0_8_,
                                        (ulong)(local_3a8._M_allocated_capacity + 1));
                      }
                      err = local_530;
                      if ((char)iVar31 != '\0') break;
                      uVar43 = uVar43 + 1;
                      lVar33 = lVar33 + 0x20;
                    } while (uVar43 < (ulong)((long)(local_558._M_string_length -
                                                    (long)local_558._M_dataplus._M_p) >> 5));
                  }
                  if ((err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) && (!bVar27)) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(err,"WARN: Failed to load material file(s). Use default material.\n");
                  }
                }
LAB_00109300:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_558);
              }
            }
            else {
              if (bVar1 == 0x74) {
                if ((paVar39->_M_local_buf[1] == 0x20) || (paVar39->_M_local_buf[1] == 9)) {
                  local_3b8._0_8_ = local_3b8 + 0x10;
                  local_3b8._8_8_ = (vertex_index *)0x0;
                  local_3a8._M_allocated_capacity =
                       local_3a8._M_allocated_capacity & 0xffffffffffffff00;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + 2);
                  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
                  local_558._M_string_length = 0;
                  local_558.field_2._M_allocated_capacity =
                       local_558.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  sVar32 = strspn(local_590->_M_local_buf," \t");
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar39->_M_local_buf + sVar32 + 2);
                  local_590 = paVar39;
                  sVar32 = strcspn(paVar39->_M_local_buf," \t\r");
                  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar39->_M_local_buf + sVar32);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_588,paVar39,paVar41);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_558,&local_588);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_588._M_dataplus._M_p != &local_588.field_2) {
                    operator_delete(local_588._M_dataplus._M_p,
                                    local_588.field_2._M_allocated_capacity + 1);
                  }
                  local_590 = paVar41;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3b8,&local_558);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_558._M_dataplus._M_p != &local_558.field_2) {
                    operator_delete(local_558._M_dataplus._M_p,
                                    local_558.field_2._M_allocated_capacity + 1);
                  }
                  sVar32 = strspn(paVar41->_M_local_buf," \t");
                  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar41->_M_local_buf + sVar32);
                  local_590 = paVar41;
                  iVar31 = atoi(paVar41->_M_local_buf);
                  sVar32 = strcspn(paVar41->_M_local_buf,"/ \t\r");
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar41->_M_local_buf + sVar32);
                  if (paVar41->_M_local_buf[sVar32] == 0x2f) {
                    local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar39->_M_local_buf + 1);
                    sVar32 = strspn(local_590->_M_local_buf," \t");
                    paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + sVar32 + 1);
                    local_590 = paVar39;
                    local_4d0 = atoi(paVar39->_M_local_buf);
                    sVar32 = strcspn(paVar39->_M_local_buf,"/ \t\r");
                    paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar39->_M_local_buf + sVar32);
                    if (paVar39->_M_local_buf[sVar32] == 0x2f) {
                      local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(paVar41->_M_local_buf + 1);
                      sVar32 = strspn(local_590->_M_local_buf," \t");
                      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar41->_M_local_buf + sVar32 + 1);
                      local_590 = paVar41;
                      iVar29 = atoi(paVar41->_M_local_buf);
                      sVar32 = strcspn(paVar41->_M_local_buf," \t\r");
                      local_470 = (size_type)iVar29;
                      local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(paVar41->_M_local_buf + sVar32);
                    }
                    else {
                      local_470 = 0;
                      local_590 = paVar41;
                    }
                  }
                  else {
                    local_470 = 0;
                    local_4d0 = 0;
                    local_590 = paVar39;
                  }
                  std::vector<int,_std::allocator<int>_>::resize
                            ((vector<int,_std::allocator<int>_> *)(local_3b8 + 0x20),(long)iVar31);
                  paVar39 = local_590;
                  if (iVar31 != 0) {
                    local_200 = local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                    sVar44 = 0;
                    local_560 = (long)iVar31;
                    do {
                      sVar32 = strspn(paVar39->_M_local_buf," \t");
                      pbVar42 = (byte *)(paVar39->_M_local_buf + sVar32);
                      iVar31 = atoi((char *)pbVar42);
                      sVar32 = strcspn((char *)pbVar42," \t\r");
                      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(pbVar42 + sVar32);
                      local_200[sVar44] = iVar31;
                      sVar44 = sVar44 + 1;
                    } while (local_560 != sVar44);
                  }
                  sVar44 = (size_type)local_4d0;
                  local_590 = paVar39;
                  std::vector<float,_std::allocator<float>_>::resize
                            ((vector<float,_std::allocator<float>_> *)(local_3b8 + 0x38),sVar44);
                  if (local_4d0 != 0) {
                    sVar45 = 0;
                    do {
                      rVar46 = parseReal((char **)&local_590,0.0);
                      vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar45] = rVar46;
                      sVar45 = sVar45 + 1;
                    } while (sVar44 != sVar45);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(local_3b8 + 0x50),local_470);
                  paVar39 = local_590;
                  if (local_470 != 0) {
                    lVar33 = 0;
                    do {
                      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
                      local_558._M_string_length = 0;
                      local_558.field_2._M_allocated_capacity =
                           local_558.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      sVar32 = strspn(paVar39->_M_local_buf," \t");
                      pbVar42 = (byte *)(paVar39->_M_local_buf + sVar32);
                      sVar32 = strcspn((char *)pbVar42," \t\r");
                      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(pbVar42 + sVar32);
                      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_588,pbVar42,paVar39);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (&local_558,&local_588);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_588._M_dataplus._M_p != &local_588.field_2) {
                        operator_delete(local_588._M_dataplus._M_p,
                                        local_588.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&((local_368.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar33),&local_558);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_558._M_dataplus._M_p != &local_558.field_2) {
                        operator_delete(local_558._M_dataplus._M_p,
                                        local_558.field_2._M_allocated_capacity + 1);
                      }
                      lVar33 = lVar33 + 0x20;
                      local_470 = local_470 - 1;
                    } while (local_470 != 0);
                  }
                  local_590 = paVar39;
                  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::push_back
                            (&local_218,(value_type *)local_3b8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_3b8 + 0x50));
                  err = local_530;
                  if (vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(vStack_380.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)vStack_380.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)vStack_380.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                    operator_delete((void *)local_3b8._0_8_,
                                    (ulong)(local_3a8._M_allocated_capacity + 1));
                  }
                  local_560 = local_560 & 0xffffffff00000000;
                  goto LAB_00108a47;
                }
              }
              else if (bVar1 == 0x6f) {
                if ((paVar39->_M_local_buf[1] == 0x20) || (paVar39->_M_local_buf[1] == 9)) {
                  bVar27 = exportFaceGroupToShape
                                     (&local_438,&local_4a8,&local_218,material_id,&local_528,
                                      triangulate);
                  if (bVar27) {
                    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                              (local_440,&local_438);
                  }
                  if (local_4a8.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      local_4a8.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    LoadObj();
                  }
                  local_3a8._8_8_ = 0;
                  local_3b8._0_8_ = local_3b8 + 0x10;
                  local_3b8._8_8_ = (vertex_index *)0x0;
                  local_3a8._M_allocated_capacity = 0;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_438.name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3b8);
                  paVar22 = local_438.mesh.indices.
                            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  paVar21 = local_438.mesh.indices.
                            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_438.mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                  local_438.mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish;
                  local_438.mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (paVar21 != (pointer)0x0) {
                    operator_delete(paVar21,(long)paVar22 - (long)paVar21);
                  }
                  puVar24 = local_438.mesh.num_face_vertices.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar23 = local_438.mesh.num_face_vertices.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_438.mesh.num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start;
                  local_438.mesh.num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_finish;
                  local_438.mesh.num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((pointer)puVar23 != (pointer)0x0) {
                    operator_delete(puVar23,(long)puVar24 - (long)puVar23);
                  }
                  piVar26 = local_438.mesh.material_ids.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                  piVar25 = local_438.mesh.material_ids.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                  local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)local_368.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((pointer)piVar25 != (pointer)0x0) {
                    operator_delete(piVar25,(long)piVar26 - (long)piVar25);
                  }
                  local_588.field_2._M_allocated_capacity =
                       (size_type)
                       local_438.mesh.tags.
                       super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_588._M_string_length =
                       (size_type)
                       local_438.mesh.tags.
                       super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  local_588._M_dataplus._M_p =
                       (pointer)local_438.mesh.tags.
                                super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                  local_438.mesh.tags.
                  super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       vStack_350.
                       super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  local_438.mesh.tags.
                  super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       vStack_350.
                       super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  local_438.mesh.tags.
                  super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       vStack_350.
                       super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector
                            ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)&local_588);
                  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&vStack_350)
                  ;
                  if (local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_368.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_368.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_368.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(vStack_380.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)vStack_380.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)vStack_380.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                    operator_delete((void *)local_3b8._0_8_,
                                    (ulong)(local_3a8._M_allocated_capacity + 1));
                  }
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_590->_M_local_buf + 2);
                  local_590 = paVar39;
                  std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
                  sVar32 = strlen(paVar39->_M_local_buf);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_3b8 + 0x10),paVar39->_M_local_buf,sVar32);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_528,&local_588);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_588._M_dataplus._M_p != &local_588.field_2) {
                    operator_delete(local_588._M_dataplus._M_p,
                                    local_588.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_3b8);
                  std::ios_base::~ios_base(local_228);
                  goto LAB_00108a47;
                }
              }
              else if ((bVar1 == 0x67) &&
                      ((paVar39->_M_local_buf[1] == 0x20 || (paVar39->_M_local_buf[1] == 9)))) {
                exportFaceGroupToShape
                          (&local_438,&local_4a8,&local_218,material_id,&local_528,triangulate);
                if (local_438.mesh.indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_438.mesh.indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                            (local_440,&local_438);
                }
                local_3a8._8_8_ = 0;
                local_3b8._8_8_ = (vertex_index *)0x0;
                local_3a8._M_allocated_capacity = 0;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_438.name,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b8);
                paVar22 = local_438.mesh.indices.
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                paVar21 = local_438.mesh.indices.
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_438.mesh.indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                local_438.mesh.indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                local_438.mesh.indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (paVar21 != (pointer)0x0) {
                  operator_delete(paVar21,(long)paVar22 - (long)paVar21);
                }
                puVar24 = local_438.mesh.num_face_vertices.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                puVar23 = local_438.mesh.num_face_vertices.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_438.mesh.num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                local_438.mesh.num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                local_438.mesh.num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pointer)puVar23 != (pointer)0x0) {
                  operator_delete(puVar23,(long)puVar24 - (long)puVar23);
                }
                piVar26 = local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                piVar25 = local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)local_368.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)local_368.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                local_438.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)local_368.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pointer)piVar25 != (pointer)0x0) {
                  operator_delete(piVar25,(long)piVar26 - (long)piVar25);
                }
                local_588.field_2._M_allocated_capacity =
                     (size_type)
                     local_438.mesh.tags.
                     super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_588._M_string_length =
                     (size_type)
                     local_438.mesh.tags.
                     super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_588._M_dataplus._M_p =
                     (pointer)local_438.mesh.tags.
                              super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                local_438.mesh.tags.
                super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                super__Vector_impl_data._M_start =
                     vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_438.mesh.tags.
                super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_438.mesh.tags.
                super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_350.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector
                          ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)&local_588);
                std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&vStack_350);
                if (local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_368.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_368.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_368.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (vStack_380.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_380.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)vStack_380.super__Vector_base<float,_std::allocator<float>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)vStack_380.super__Vector_base<float,_std::allocator<float>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_398.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_398.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                  operator_delete((void *)local_3b8._0_8_,
                                  (ulong)(local_3a8._M_allocated_capacity + 1));
                }
                pvVar19 = local_4a8.
                          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pvVar18 = local_4a8.
                          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar37 = local_4a8.
                          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_4a8.
                    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_4a8.
                    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  do {
                    pvVar3 = (pvVar37->
                             super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (pvVar3 != (pointer)0x0) {
                      operator_delete(pvVar3,(long)(pvVar37->
                                                                                                      
                                                  super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage - (long)pvVar3);
                    }
                    pvVar37 = pvVar37 + 1;
                  } while (pvVar37 != pvVar19);
                  local_4a8.
                  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pvVar18;
                }
                local_558._M_dataplus._M_p = (pointer)0x0;
                local_558._M_string_length = 0;
                local_558.field_2._M_allocated_capacity = 0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_558,2);
                err = local_530;
                paVar39 = local_590;
                while ((0xd < (byte)paVar39->_M_local_buf[0] ||
                       ((0x2401U >> ((byte)paVar39->_M_local_buf[0] & 0x1f) & 1) == 0))) {
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                  local_588._M_string_length = 0;
                  local_588.field_2._M_allocated_capacity =
                       local_588.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  sVar32 = strspn(paVar39->_M_local_buf," \t");
                  pbVar42 = (byte *)(paVar39->_M_local_buf + sVar32);
                  sVar32 = strcspn((char *)pbVar42," \t\r");
                  __s = pbVar42 + sVar32;
                  local_3b8._0_8_ = local_3b8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,pbVar42,__s);
                  LoadObj();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_558,&local_588);
                  sVar32 = strspn((char *)__s," \t\r");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_588._M_dataplus._M_p != &local_588.field_2) {
                    operator_delete(local_588._M_dataplus._M_p,
                                    local_588.field_2._M_allocated_capacity + 1);
                  }
                  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(__s + sVar32);
                }
                local_590 = paVar39;
                if ((pointer)local_558._M_string_length == local_558._M_dataplus._M_p) {
                  __assert_fail("names.size() > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                                ,0x6c8,
                                "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                               );
                }
                if (local_558._M_string_length - (long)local_558._M_dataplus._M_p < 0x21) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_replace(&local_528,0,local_528._M_string_length,"",0);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(&local_528,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_558._M_dataplus._M_p + 0x20));
                }
                goto LAB_00109300;
              }
              local_560 = local_560 & 0xffffffff00000000;
            }
          }
        }
      }
    }
LAB_00108a47:
    if ((local_560 & 1) != 0) goto LAB_0010a062;
  } while( true );
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *err,
             std::istream *inStream, MaterialReader *readMatFn /*= NULL*/,
             bool triangulate) {
  std::stringstream errss;

  std::vector<real_t> v;
  std::vector<real_t> vn;
  std::vector<real_t> vt;
  std::vector<real_t> vc;
  std::vector<tag_t> tags;
  std::vector<std::vector<vertex_index> > faceGroup;
  std::string name;

  // material
  std::map<std::string, int> material_map;
  int material = -1;

  shape_t shape;

  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      real_t x, y, z;
      real_t r, g, b;
      parseVertexWithColor(&x, &y, &z, &r, &g, &b, &token);
      v.push_back(x);
      v.push_back(y);
      v.push_back(z);

      vc.push_back(r);
      vc.push_back(g);
      vc.push_back(b);
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      vn.push_back(x);
      vn.push_back(y);
      vn.push_back(z);
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y;
      parseReal2(&x, &y, &token);
      vt.push_back(x);
      vt.push_back(y);
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      std::vector<vertex_index> face;
      face.reserve(3);

      while (!IS_NEW_LINE(token[0])) {
        vertex_index vi;
        if (!parseTriple(&token, static_cast<int>(v.size() / 3),
                         static_cast<int>(vn.size() / 3),
                         static_cast<int>(vt.size() / 2), &vi)) {
          if (err) {
            (*err) = "Failed parse `f' line(e.g. zero value for face index).\n";
          }
          return false;
        }

        face.push_back(vi);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      // replace with emplace_back + std::move on C++11
      faceGroup.push_back(std::vector<vertex_index>());
      faceGroup[faceGroup.size() - 1].swap(face);

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material) {
        // Create per-face material. Thus we don't add `shape` to `shapes` at
        // this time.
        // just clear `faceGroup` after `exportFaceGroupToShape()` call.
        exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                               triangulate);
        faceGroup.clear();
        material = newMaterialId;
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (err) {
            (*err) +=
                "WARN: Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), materials,
                                   &material_map, &err_mtl);
            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;  // This should be warn message.
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (err) {
              (*err) +=
                  "WARN: Failed to load material file(s). Use default "
                  "material.\n";
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      (void)ret;  // return value not used.

      if (shape.mesh.indices.size() > 0) {
        shapes->push_back(shape);
      }

      shape = shape_t();

      // material = -1;
      faceGroup.clear();

      std::vector<std::string> names;
      names.reserve(2);

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      // names[0] must be 'g', so skip the 0th element.
      if (names.size() > 1) {
        name = names[1];
      } else {
        name = "";
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      if (ret) {
        shapes->push_back(shape);
      }

      // material = -1;
      faceGroup.clear();
      shape = shape_t();

      // @todo { multiple object name? }
      token += 2;
      std::stringstream ss;
      ss << token;
      name = ss.str();

      continue;
    }

    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;

      tag.name = parseString(&token);

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = parseInt(&token);
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        tag.stringValues[i] = parseString(&token);
      }

      tags.push_back(tag);
    }

    // Ignore unknown command.
  }

  bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                    triangulate);
  // exportFaceGroupToShape return false when `usemtl` is called in the last
  // line.
  // we also add `shape` to `shapes` when `shape.mesh` has already some
  // faces(indices)
  if (ret || shape.mesh.indices.size()) {
    shapes->push_back(shape);
  }
  faceGroup.clear();  // for safety

  if (err) {
    (*err) += errss.str();
  }

  attrib->vertices.swap(v);
  attrib->normals.swap(vn);
  attrib->texcoords.swap(vt);
  attrib->colors.swap(vc);

  return true;
}